

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::
     generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool allowMatrixCases,int expandLevel)

{
  undefined4 uVar1;
  Node *pNVar2;
  SharedPtrStateBase *pSVar3;
  ResourceTestCase *this;
  long lVar4;
  deInt32 *pdVar5;
  SharedPtr variable;
  SharedPtr local_68;
  int local_54;
  TestNode *local_50;
  Context *local_48;
  SharedPtr *local_40;
  ProgramResourceQueryTestTarget local_38;
  
  lVar4 = 0;
  local_54 = expandLevel;
  local_50 = &targetGroup->super_TestNode;
  local_48 = context;
  local_40 = parentStructure;
  do {
    if (((allowMatrixCases) ||
        ((&generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
           ::variableTypes[0].isMatrix)[lVar4] == false)) &&
       (*(int *)((long)&generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
                        ::variableTypes[0].level + lVar4) <= expandLevel)) {
      pNVar2 = (Node *)operator_new(0x28);
      uVar1 = *(undefined4 *)
               ((long)&generateProgramInputOutputTypeBasicTypeCases<(deqp::gles31::Functional::ProgramInterface)4>
                       ::variableTypes[0].type + lVar4);
      pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar2->m_type = TYPE_VARIABLE;
      (pNVar2->m_enclosingNode).m_ptr = local_40->m_ptr;
      pSVar3 = local_40->m_state;
      (pNVar2->m_enclosingNode).m_state = pSVar3;
      if (pSVar3 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar5 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
        *pdVar5 = *pdVar5 + 1;
        UNLOCK();
      }
      pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
      *(undefined4 *)&pNVar2[1]._vptr_Node = uVar1;
      local_68.m_state = (SharedPtrStateBase *)0x0;
      local_68.m_ptr = pNVar2;
      pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar3->strongRefCount = 0;
      pSVar3->weakRefCount = 0;
      pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
      pSVar3->strongRefCount = 1;
      pSVar3->weakRefCount = 1;
      local_68.m_state = pSVar3;
      this = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                (&local_38,PROGRAMINTERFACE_PROGRAM_OUTPUT,0x800);
      ResourceTestCase::ResourceTestCase(this,local_48,&local_68,&local_38,(char *)0x0);
      tcu::TestNode::addChild(local_50,(TestNode *)this);
      pdVar5 = &pSVar3->strongRefCount;
      LOCK();
      *pdVar5 = *pdVar5 + -1;
      UNLOCK();
      if (*pdVar5 == 0) {
        local_68.m_ptr = (Node *)0x0;
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      expandLevel = local_54;
      LOCK();
      pdVar5 = &(local_68.m_state)->weakRefCount;
      *pdVar5 = *pdVar5 + -1;
      UNLOCK();
      if (*pdVar5 == 0) {
        if (local_68.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_68.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    lVar4 = lVar4 + 0xc;
  } while (lVar4 != 0xfc);
  return;
}

Assistant:

static void generateProgramInputOutputTypeBasicTypeCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, bool allowMatrixCases, int expandLevel)
{
	static const struct
	{
		glu::DataType	type;
		bool			isMatrix;
		int				level;
	} variableTypes[] =
	{
		{ glu::TYPE_FLOAT,			false,		0	},
		{ glu::TYPE_INT,			false,		1	},
		{ glu::TYPE_UINT,			false,		1	},
		{ glu::TYPE_FLOAT_VEC2,		false,		2	},
		{ glu::TYPE_FLOAT_VEC3,		false,		1	},
		{ glu::TYPE_FLOAT_VEC4,		false,		2	},
		{ glu::TYPE_INT_VEC2,		false,		0	},
		{ glu::TYPE_INT_VEC3,		false,		2	},
		{ glu::TYPE_INT_VEC4,		false,		2	},
		{ glu::TYPE_UINT_VEC2,		false,		2	},
		{ glu::TYPE_UINT_VEC3,		false,		2	},
		{ glu::TYPE_UINT_VEC4,		false,		0	},
		{ glu::TYPE_FLOAT_MAT2,		true,		2	},
		{ glu::TYPE_FLOAT_MAT2X3,	true,		2	},
		{ glu::TYPE_FLOAT_MAT2X4,	true,		2	},
		{ glu::TYPE_FLOAT_MAT3X2,	true,		0	},
		{ glu::TYPE_FLOAT_MAT3,		true,		2	},
		{ glu::TYPE_FLOAT_MAT3X4,	true,		2	},
		{ glu::TYPE_FLOAT_MAT4X2,	true,		2	},
		{ glu::TYPE_FLOAT_MAT4X3,	true,		2	},
		{ glu::TYPE_FLOAT_MAT4,		true,		2	},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(variableTypes); ++ndx)
	{
		if (!allowMatrixCases && variableTypes[ndx].isMatrix)
			continue;

		if (variableTypes[ndx].level <= expandLevel)
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(parentStructure, variableTypes[ndx].type));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(interface, PROGRAMRESOURCEPROP_TYPE)));
		}
	}
}